

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O0

void __thiscall AtomicFile::impl::finalize(impl *this)

{
  bool bVar1;
  int iVar2;
  char *__new;
  string *__return_storage_ptr__;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  string local_158;
  string local_138;
  undefined1 local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  impl *local_10;
  impl *this_local;
  
  if (((this->is_temp_active & 1U) != 0) && (allow_atomics)) {
    local_10 = this;
    bVar1 = Path::exists(&(this->temp_file).super_Path);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Moving \'{1}\' -> \'{2}\'",&local_51);
      std::__cxx11::string::string
                ((string *)&local_88,(string *)&(this->temp_file).super_Path._data);
      std::__cxx11::string::string
                ((string *)&local_a8,(string *)&(this->real_file).super_Path._data);
      format<std::__cxx11::string,std::__cxx11::string>(&local_30,&local_50,&local_88,&local_a8);
      debug(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      __new = (char *)std::__cxx11::string::c_str();
      iVar2 = rename(pcVar3,__new);
      if (iVar2 != 0) {
        local_111 = 1;
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,
                   "Failed copying \'{1}\' to \'{2}\'. Database corruption possible.",&local_c9);
        std::__cxx11::string::string
                  ((string *)&local_f0,(string *)&(this->temp_file).super_Path._data);
        std::__cxx11::string::string
                  ((string *)&local_110,(string *)&(this->real_file).super_Path._data);
        format<std::__cxx11::string,std::__cxx11::string>
                  (__return_storage_ptr__,&local_c8,&local_f0,&local_110);
        local_111 = 0;
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"Removing \'{1}\'",&local_159);
      std::__cxx11::string::string
                ((string *)&local_180,(string *)&(this->real_file).super_Path._data);
      format<std::__cxx11::string>(&local_138,&local_158,&local_180);
      debug(&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      ::remove(pcVar3);
    }
    this->is_temp_active = false;
  }
  return;
}

Assistant:

void AtomicFile::impl::finalize ()
{
  if (is_temp_active && impl::allow_atomics)
  {
    if (temp_file.exists ())
    {
      debug (format ("Moving '{1}' -> '{2}'", temp_file._data, real_file._data));
      if (std::rename (temp_file._data.c_str (), real_file._data.c_str ()))
      {
        throw format("Failed copying '{1}' to '{2}'. Database corruption possible.",
            temp_file._data, real_file._data);
      }
    }
    else
    {
      debug (format ("Removing '{1}'", real_file._data));
      std::remove (real_file._data.c_str ());
    }
    is_temp_active = false;
  }
}